

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O0

void stbir__decode_uint16_linear_AR(float *decodep,int width_times_channels,void *inputp)

{
  undefined8 uVar1;
  undefined8 uVar2;
  float *pfVar3;
  bool bVar4;
  __m128i zero;
  __m128 of1;
  __m128 of0;
  __m128i o1;
  __m128i o0;
  __m128i i;
  unsigned_short *end_input_m8;
  unsigned_short *input;
  float *decode_end;
  float *decode;
  void *inputp_local;
  int width_times_channels_local;
  float *decodep_local;
  ushort local_a8;
  ushort uStack_a6;
  ushort uStack_a4;
  ushort uStack_a2;
  ushort uStack_50;
  ushort uStack_4e;
  ushort uStack_4c;
  ushort uStack_4a;
  uint uStack_24;
  uint uStack_1c;
  uint uStack_14;
  uint uStack_c;
  
  pfVar3 = decodep + width_times_channels;
  if (width_times_channels < 8) {
    end_input_m8 = (unsigned_short *)inputp;
    for (decode_end = decodep + 4; decode_end <= pfVar3; decode_end = decode_end + 4) {
      decode_end[-4] = (float)end_input_m8[1];
      decode_end[-3] = (float)*end_input_m8;
      decode_end[-2] = (float)end_input_m8[3];
      decode_end[-1] = (float)end_input_m8[2];
      end_input_m8 = end_input_m8 + 4;
    }
    for (decode_end = decode_end + -4; decode_end < pfVar3; decode_end = decode_end + 2) {
      *decode_end = (float)end_input_m8[1];
      decode_end[1] = (float)*end_input_m8;
      end_input_m8 = end_input_m8 + 2;
    }
  }
  else {
    end_input_m8 = (unsigned_short *)inputp;
    decode_end = decodep;
    do {
      do {
        uVar1 = *(undefined8 *)end_input_m8;
        uVar2 = *(undefined8 *)(end_input_m8 + 4);
        local_a8 = (ushort)uVar1;
        uStack_a6 = (ushort)((ulong)uVar1 >> 0x10);
        uStack_a4 = (ushort)((ulong)uVar1 >> 0x20);
        uStack_a2 = (ushort)((ulong)uVar1 >> 0x30);
        uStack_50 = (ushort)uVar2;
        uStack_4e = (ushort)((ulong)uVar2 >> 0x10);
        uStack_4c = (ushort)((ulong)uVar2 >> 0x20);
        uStack_4a = (ushort)((ulong)uVar2 >> 0x30);
        uStack_14 = (uint)uStack_a6;
        uStack_c = (uint)uStack_a2;
        uStack_24 = (uint)uStack_4e;
        uStack_1c = (uint)uStack_4a;
        *(ulong *)decode_end = CONCAT44((float)local_a8,(float)uStack_14);
        *(ulong *)(decode_end + 2) = CONCAT44((float)uStack_a4,(float)uStack_c);
        *(ulong *)(decode_end + 4) = CONCAT44((float)uStack_50,(float)uStack_24);
        *(ulong *)(decode_end + 6) = CONCAT44((float)uStack_4c,(float)uStack_1c);
        decode_end = decode_end + 8;
        end_input_m8 = end_input_m8 + 8;
      } while (decode_end <= pfVar3 + -8);
      bVar4 = decode_end != pfVar3;
      end_input_m8 = (unsigned_short *)((long)inputp + (long)width_times_channels * 2 + -0x10);
      decode_end = pfVar3 + -8;
    } while (bVar4);
  }
  return;
}

Assistant:

static void STBIR__CODER_NAME(stbir__decode_uint16_linear)( float * decodep, int width_times_channels, void const * inputp )
{
  float STBIR_STREAMOUT_PTR( * ) decode = decodep;
  float * decode_end = (float*) decode + width_times_channels;
  unsigned short const * input = (unsigned short const *)inputp;

  #ifdef STBIR_SIMD
  unsigned short const * end_input_m8 = input + width_times_channels - 8;
  if ( width_times_channels >= 8 )
  {
    decode_end -= 8;
    STBIR_NO_UNROLL_LOOP_START_INF_FOR
    for(;;)
    {
      #ifdef STBIR_SIMD8
      stbir__simdi i; stbir__simdi8 o;
      stbir__simdf8 of;
      STBIR_NO_UNROLL(decode);
      stbir__simdi_load( i, input );
      stbir__simdi8_expand_u16_to_u32( o, i );
      stbir__simdi8_convert_i32_to_float( of, o );
      stbir__decode_simdf8_flip( of );
      stbir__simdf8_store( decode + 0, of );
      #else
      stbir__simdi i, o0, o1;
      stbir__simdf of0, of1;
      STBIR_NO_UNROLL(decode);
      stbir__simdi_load( i, input );
      stbir__simdi_expand_u16_to_u32( o0, o1, i );
      stbir__simdi_convert_i32_to_float( of0, o0 );
      stbir__simdi_convert_i32_to_float( of1, o1 );
      stbir__decode_simdf4_flip( of0 );
      stbir__decode_simdf4_flip( of1 );
      stbir__simdf_store( decode + 0,  of0 );
      stbir__simdf_store( decode + 4,  of1 );
      #endif
      decode += 8;
      input += 8;
      if ( decode <= decode_end )
        continue;
      if ( decode == ( decode_end + 8 ) )
        break;
      decode = decode_end; // backup and do last couple
      input = end_input_m8;
    }
    return;
  }
  #endif

  // try to do blocks of 4 when you can
  #if stbir__coder_min_num != 3 // doesn't divide cleanly by four
  decode += 4;
  STBIR_SIMD_NO_UNROLL_LOOP_START
  while( decode <= decode_end )
  {
    STBIR_SIMD_NO_UNROLL(decode);
    decode[0-4] = ((float)(input[stbir__decode_order0]));
    decode[1-4] = ((float)(input[stbir__decode_order1]));
    decode[2-4] = ((float)(input[stbir__decode_order2]));
    decode[3-4] = ((float)(input[stbir__decode_order3]));
    decode += 4;
    input += 4;
  }
  decode -= 4;
  #endif

  // do the remnants
  #if stbir__coder_min_num < 4
  STBIR_NO_UNROLL_LOOP_START
  while( decode < decode_end )
  {
    STBIR_NO_UNROLL(decode);
    decode[0] = ((float)(input[stbir__decode_order0]));
    #if stbir__coder_min_num >= 2
    decode[1] = ((float)(input[stbir__decode_order1]));
    #endif
    #if stbir__coder_min_num >= 3
    decode[2] = ((float)(input[stbir__decode_order2]));
    #endif
    decode += stbir__coder_min_num;
    input += stbir__coder_min_num;
  }
  #endif
}